

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConcurrentPtrQueue.hpp
# Opt level: O0

bool __thiscall
sftm::CConcurrentPtrQueue<sftm::CTask>::Push<SyncTest()::CSyncEndTask>
          (CConcurrentPtrQueue<sftm::CTask> *this,CSyncEndTask *pItem,uint32_t nCount)

{
  uint local_38;
  uint32_t n;
  lock_guard<sftm::CSpinLock> lock;
  CTask *pCStack_20;
  uint32_t nCount_local;
  CSyncEndTask *pItem_local;
  CConcurrentPtrQueue<sftm::CTask> *this_local;
  
  lock._M_device._4_4_ = nCount;
  std::lock_guard<sftm::CSpinLock>::lock_guard((lock_guard<sftm::CSpinLock> *)&n,&this->m_lock);
  if (this->m_nCount + lock._M_device._4_4_ < 0x200) {
    local_38 = 0;
    pCStack_20 = &pItem->super_CTask;
    for (; local_38 < lock._M_device._4_4_; local_38 = local_38 + 1) {
      this->m_pItems[this->m_nCount + local_38] = pCStack_20;
      pCStack_20 = pCStack_20 + 1;
    }
    this->m_nCount = lock._M_device._4_4_ + this->m_nCount;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  std::lock_guard<sftm::CSpinLock>::~lock_guard((lock_guard<sftm::CSpinLock> *)&n);
  return this_local._7_1_;
}

Assistant:

bool Push(TItem* pItem, std::uint32_t nCount) noexcept
		{
			std::lock_guard<CSyncPrimitive> lock(m_lock);

			if (m_nCount + nCount >= QUEUE_PHYSICAL_SIZE)
				return false;

			for (std::uint32_t n = 0; n < nCount; ++n)
			{
				m_pItems[m_nCount + n] = pItem;
				++pItem;
			}

			m_nCount += nCount;

			return true;
		}